

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O0

char * retrieveLOName(Abc_Ntk_t *pNtkOld,Aig_Man_t *pAigOld,Aig_Man_t *pAigNew,Aig_Obj_t *pObjPivot,
                     Vec_Ptr_t *vLive,Vec_Ptr_t *vFair)

{
  Vec_Ptr_t *p;
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  char *dummyStr;
  int local_68;
  int i;
  int strMatch;
  int originalLatchNum;
  int oldIndex;
  int index;
  Abc_Obj_t *pNode;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObjOld;
  Vec_Ptr_t *vFair_local;
  Vec_Ptr_t *vLive_local;
  Aig_Obj_t *pObjPivot_local;
  Aig_Man_t *pAigNew_local;
  Aig_Man_t *pAigOld_local;
  Abc_Ntk_t *pNtkOld_local;
  
  iVar1 = Saig_ManRegNum(pAigOld);
  pNtkOld_local = (Abc_Ntk_t *)malloc(0x32);
  iVar2 = Saig_ObjIsLo(pAigNew,pObjPivot);
  if (iVar2 == 0) {
    __assert_fail("Saig_ObjIsLo( pAigNew, pObjPivot )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                  ,0x90,
                  "char *retrieveLOName(Abc_Ntk_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  for (originalLatchNum = 0; iVar2 = Saig_ManRegNum(pAigNew), originalLatchNum < iVar2;
      originalLatchNum = originalLatchNum + 1) {
    p = pAigNew->vCis;
    iVar2 = Saig_ManPiNum(pAigNew);
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p,originalLatchNum + iVar2);
    if (pAVar4 == pObjPivot) break;
  }
  if (originalLatchNum < iVar1) {
    iVar1 = Saig_ManPiNum(pAigOld);
    pAVar4 = Aig_ManCi(pAigOld,iVar1 + originalLatchNum);
    pAVar5 = Abc_NtkCi(pNtkOld,iVar1 + originalLatchNum);
    if ((Aig_Obj_t *)(pAVar4->field_5).pData != pObjPivot) {
      __assert_fail("pObjOld->pData == pObjPivot",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                    ,0x99,
                    "char *retrieveLOName(Abc_Ntk_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    pNtkOld_local = (Abc_Ntk_t *)Abc_ObjName(pAVar5);
  }
  else if (originalLatchNum == iVar1) {
    pNtkOld_local = (Abc_Ntk_t *)anon_var_dwarf_383821;
  }
  else if ((iVar1 < originalLatchNum) && (originalLatchNum < iVar1 * 2 + 1)) {
    iVar2 = Saig_ManPiNum(pAigOld);
    iVar1 = ((iVar2 + originalLatchNum) - iVar1) + -1;
    Aig_ManCi(pAigOld,iVar1);
    pAVar5 = Abc_NtkCi(pNtkOld,iVar1);
    pcVar6 = Abc_ObjName(pAVar5);
    sprintf((char *)pNtkOld_local,"%s__%s",pcVar6,"SHADOW");
  }
  else if ((originalLatchNum < iVar1 * 2 + 1) ||
          (iVar2 = Vec_PtrSize(vLive), iVar1 * 2 + 1 + iVar2 <= originalLatchNum)) {
    iVar2 = Vec_PtrSize(vLive);
    if (iVar1 * 2 + 1 + iVar2 <= originalLatchNum) {
      iVar2 = Vec_PtrSize(vLive);
      iVar3 = Vec_PtrSize(vFair);
      if (originalLatchNum < iVar1 * 2 + 1 + iVar2 + iVar3) {
        iVar2 = Vec_PtrSize(vLive);
        local_68 = 0;
        *(undefined1 *)&pNtkOld_local->ntkType = ABC_NTK_NONE;
        dummyStr._4_4_ = 0;
        do {
          iVar3 = Saig_ManPoNum(pAigOld);
          if (iVar3 <= dummyStr._4_4_) {
LAB_007bc605:
            if ((char)pNtkOld_local->ntkType != ABC_NTK_NONE) {
              return (char *)pNtkOld_local;
            }
            __assert_fail("dummyStr[0] != \'\\0\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                          ,0xd3,
                          "char *retrieveLOName(Abc_Ntk_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                         );
          }
          Vec_PtrEntry(pAigOld->vCos,dummyStr._4_4_);
          pAVar5 = Abc_NtkPo(pNtkOld,dummyStr._4_4_);
          iVar3 = nodeName_starts_with(pAVar5,"assume_fair");
          if (iVar3 != 0) {
            if (local_68 == (originalLatchNum + iVar1 * -2 + -1) - iVar2) {
              pcVar6 = Abc_ObjName(pAVar5);
              sprintf((char *)pNtkOld_local,"%s__%s",pcVar6,"FAIRNESS");
              goto LAB_007bc605;
            }
            local_68 = local_68 + 1;
          }
          dummyStr._4_4_ = dummyStr._4_4_ + 1;
        } while( true );
      }
    }
    pNtkOld_local = (Abc_Ntk_t *)0xcd34e5;
  }
  else {
    local_68 = 0;
    *(undefined1 *)&pNtkOld_local->ntkType = ABC_NTK_NONE;
    for (dummyStr._4_4_ = 0; iVar2 = Saig_ManPoNum(pAigOld), dummyStr._4_4_ < iVar2;
        dummyStr._4_4_ = dummyStr._4_4_ + 1) {
      Vec_PtrEntry(pAigOld->vCos,dummyStr._4_4_);
      pAVar5 = Abc_NtkPo(pNtkOld,dummyStr._4_4_);
      iVar2 = nodeName_starts_with(pAVar5,"assert_fair");
      if (iVar2 != 0) {
        if (local_68 == originalLatchNum + iVar1 * -2 + -1) {
          pcVar6 = Abc_ObjName(pAVar5);
          sprintf((char *)pNtkOld_local,"%s__%s",pcVar6,"LIVENESS");
          break;
        }
        local_68 = local_68 + 1;
      }
    }
    if ((char)pNtkOld_local->ntkType == ABC_NTK_NONE) {
      __assert_fail("dummyStr[0] != \'\\0\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                    ,0xbb,
                    "char *retrieveLOName(Abc_Ntk_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
  }
  return (char *)pNtkOld_local;
}

Assistant:

char * retrieveLOName( Abc_Ntk_t *pNtkOld, Aig_Man_t *pAigOld, Aig_Man_t *pAigNew, Aig_Obj_t *pObjPivot, Vec_Ptr_t *vLive, Vec_Ptr_t * vFair )
{
    Aig_Obj_t *pObjOld, *pObj;
    Abc_Obj_t *pNode;
    int index, oldIndex, originalLatchNum = Saig_ManRegNum(pAigOld), strMatch, i;
    char *dummyStr = (char *)malloc( sizeof(char) * 50 );

    assert( Saig_ObjIsLo( pAigNew, pObjPivot ) );
    Saig_ManForEachLo( pAigNew, pObj, index )
        if( pObj == pObjPivot )
            break;
    if( index < originalLatchNum )
    {
        oldIndex = Saig_ManPiNum( pAigOld ) + index;
        pObjOld = Aig_ManCi( pAigOld, oldIndex );
        pNode = Abc_NtkCi( pNtkOld, oldIndex );
        assert( pObjOld->pData == pObjPivot );
        return Abc_ObjName( pNode );
    }
    else if( index == originalLatchNum )
        return "SAVED_LO";
    else if( index > originalLatchNum && index < 2 * originalLatchNum + 1 )
    {
        oldIndex = Saig_ManPiNum( pAigOld ) + index - originalLatchNum - 1;
        pObjOld = Aig_ManCi( pAigOld, oldIndex );
        pNode = Abc_NtkCi( pNtkOld, oldIndex );
        sprintf( dummyStr, "%s__%s", Abc_ObjName( pNode ), "SHADOW");
        return dummyStr;
    }
    else if( index >= 2 * originalLatchNum + 1 && index < 2 * originalLatchNum + 1 + Vec_PtrSize( vLive ) )
    {
        oldIndex = index - 2 * originalLatchNum - 1;
        strMatch = 0;
        dummyStr[0] = '\0';
        Saig_ManForEachPo( pAigOld, pObj, i )
        {
            pNode = Abc_NtkPo( pNtkOld, i );
            //if( strstr( Abc_ObjName( pNode ), "assert_fair" ) != NULL )
            if(    nodeName_starts_with( pNode, "assert_fair" ) )
            {
                if( strMatch == oldIndex )
                {
                    sprintf( dummyStr, "%s__%s", Abc_ObjName( pNode ), "LIVENESS");
                    //return dummyStr;
                    break;
                }
                else
                    strMatch++;
            }
        }
        assert( dummyStr[0] != '\0' );
        return dummyStr;
    }
    else if( index >= 2 * originalLatchNum + 1 + Vec_PtrSize( vLive ) && index < 2 * originalLatchNum + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) )
    {
        oldIndex = index - 2 * originalLatchNum - 1 - Vec_PtrSize( vLive );
        strMatch = 0;
        dummyStr[0] = '\0';
        Saig_ManForEachPo( pAigOld, pObj, i )
        {
            pNode = Abc_NtkPo( pNtkOld, i );
            //if( strstr( Abc_ObjName( pNode ), "assume_fair" ) != NULL )
            if(    nodeName_starts_with( pNode, "assume_fair" ) )
            {
                if( strMatch == oldIndex )
                {
                    sprintf( dummyStr, "%s__%s", Abc_ObjName( pNode ), "FAIRNESS");
                    //return dummyStr;
                    break;
                }
                else
                    strMatch++;
            }
        }
        assert( dummyStr[0] != '\0' );
        return dummyStr;
    }
    else
        return "UNKNOWN";
}